

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void __thiscall cmSystemToolsArgV::~cmSystemToolsArgV(cmSystemToolsArgV *this)

{
  bool bVar1;
  char **local_18;
  char **arg;
  cmSystemToolsArgV *this_local;
  
  local_18 = this->ArgV;
  while( true ) {
    bVar1 = false;
    if (local_18 != (char **)0x0) {
      bVar1 = *local_18 != (char *)0x0;
    }
    if (!bVar1) break;
    free(*local_18);
    local_18 = local_18 + 1;
  }
  free(this->ArgV);
  return;
}

Assistant:

~cmSystemToolsArgV()
  {
    for (char** arg = this->ArgV; arg && *arg; ++arg) {
      free(*arg);
    }
    free(this->ArgV);
  }